

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O2

void __thiscall soplex::CLUFactorRational::remaxRow(CLUFactorRational *this,int p_row,int len)

{
  int *piVar1;
  Dring *pDVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  pointer pnVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if ((U *)(this->u).row.elem[p_row].next == &this->u) {
    piVar7 = (this->u).row.max;
    iVar10 = len - piVar7[p_row];
    iVar6 = (this->u).row.used;
    if ((int)((ulong)((long)*(pointer *)
                             ((long)&(this->u).row.val.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                     (long)(this->u).row.val.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) - iVar6 < iVar10) {
      packRows(this);
      piVar7 = (this->u).row.max;
      iVar6 = (this->u).row.used;
      iVar10 = len - piVar7[p_row];
      if ((double)(int)((ulong)((long)*(pointer *)
                                       ((long)&(this->u).row.val.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                               (long)(this->u).row.val.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6) <
          (double)len + (double)iVar6 * this->rowMemMult) {
        minRowMem(this,len + iVar6 * 2);
        iVar6 = (this->u).row.used;
        piVar7 = (this->u).row.max;
      }
    }
    (this->u).row.used = iVar6 + iVar10;
    piVar7[p_row] = len;
  }
  else {
    iVar6 = (this->u).row.used;
    if ((int)((ulong)((long)*(pointer *)
                             ((long)&(this->u).row.val.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                     (long)(this->u).row.val.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) - iVar6 < len) {
      packRows(this);
      iVar6 = (this->u).row.used;
      if ((double)(int)((ulong)((long)*(pointer *)
                                       ((long)&(this->u).row.val.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                               (long)(this->u).row.val.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6) <
          (double)len + (double)iVar6 * this->rowMemMult) {
        minRowMem(this,len + iVar6 * 2);
        iVar6 = (this->u).row.used;
      }
    }
    piVar1 = (this->u).row.idx;
    piVar7 = (this->u).row.start;
    lVar11 = (long)piVar7[p_row];
    lVar8 = (this->u).row.len[p_row] + lVar11;
    piVar7[p_row] = iVar6;
    piVar7 = &(this->u).row.used;
    *piVar7 = *piVar7 + len;
    pDVar2 = (this->u).row.elem;
    piVar7 = (this->u).row.max;
    pDVar3 = pDVar2[p_row].prev;
    piVar7[pDVar3->idx] = piVar7[pDVar3->idx] + piVar7[p_row];
    piVar7[p_row] = len;
    pDVar4 = pDVar2[p_row].next;
    pDVar4->prev = pDVar3;
    pDVar3->next = pDVar4;
    pDVar3 = (this->u).row.list.prev;
    pDVar4 = pDVar3->next;
    pDVar2[p_row].next = pDVar4;
    pDVar4->prev = pDVar2 + p_row;
    pDVar2[p_row].prev = pDVar3;
    pDVar3->next = pDVar2 + p_row;
    lVar9 = (long)iVar6;
    lVar12 = lVar11 << 6;
    lVar13 = lVar9 << 6;
    for (; lVar11 < lVar8; lVar11 = lVar11 + 1) {
      pnVar5 = (this->u).row.val.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)((long)&(pnVar5->m_backend).m_value + lVar13),
                  (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)((long)&(pnVar5->m_backend).m_value + lVar12));
      piVar1[lVar9] = piVar1[lVar11];
      lVar9 = lVar9 + 1;
      lVar12 = lVar12 + 0x40;
      lVar13 = lVar13 + 0x40;
    }
  }
  return;
}

Assistant:

inline void CLUFactorRational::remaxRow(int p_row, int len)
{
   assert(u.row.max[p_row] < len);

   if(u.row.elem[p_row].next == &(u.row.list))      /* last in row file */
   {
      int delta = len - u.row.max[p_row];

      if(delta > u.row.val.dim() - u.row.used)
      {
         packRows();
         delta = len - u.row.max[p_row];  // packRows() changes u.row.max[] !

         if(u.row.val.dim() < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len); */
      }

      assert(delta <= u.row.val.dim() - u.row.used

             && "ERROR: could not allocate memory for row file");

      u.row.used += delta;
      u.row.max[p_row] = len;
   }
   else                        /* row must be moved to end of row file */
   {
      int i, j, k;
      VectorRational& val = u.row.val;
      Dring* ring;

      if(len > u.row.val.dim() - u.row.used)
      {
         packRows();

         if(u.row.val.dim() < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len);*/
      }

      assert(len <= u.row.val.dim() - u.row.used

             && "ERROR: could not allocate memory for row file");

      int* idx = u.row.idx;
      j = u.row.used;
      i = u.row.start[p_row];
      k = u.row.len[p_row] + i;
      u.row.start[p_row] = j;
      u.row.used += len;

      u.row.max[u.row.elem[p_row].prev->idx] += u.row.max[p_row];
      u.row.max[p_row] = len;
      removeDR(u.row.elem[p_row]);
      ring = u.row.list.prev;
      init2DR(u.row.elem[p_row], *ring);

      for(; i < k; ++i, ++j)
      {
         val[j] = val[i];
         idx[j] = idx[i];
      }
   }

   assert(u.row.start[u.row.list.prev->idx] + u.row.max[u.row.list.prev->idx]

          == u.row.used);
}